

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pcVar1;
  ThreadedSectionInfo **ppTVar2;
  ThreadedSectionInfo *pTVar3;
  string *psVar4;
  ostream *poVar5;
  ostream *poVar6;
  __normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>
  __tmp;
  iterator iVar7;
  SourceLineInfo *pSVar8;
  Colour colourGuard;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  Colour local_51;
  ThreadedSectionInfo *local_50;
  ThreadedSectionInfo **local_48;
  iterator iStack_40;
  ThreadedSectionInfo **local_38 [2];
  size_t local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase).unusedTestCaseInfo.nullableValue)->name
                 );
  if ((this->super_StreamingReporterBase).currentSectionInfo.m_p == (ThreadedSectionInfo *)0x0) {
    pTVar3 = (ThreadedSectionInfo *)0x0;
  }
  else {
    Colour::Colour(&local_51,Headers);
    local_48 = (ThreadedSectionInfo **)0x0;
    iStack_40._M_current = (ThreadedSectionInfo **)0x0;
    local_38[0] = (ThreadedSectionInfo **)0x0;
    local_50 = (this->super_StreamingReporterBase).currentSectionInfo.m_p;
    if (local_50 != (ThreadedSectionInfo *)0x0) {
      do {
        if (iStack_40._M_current == local_38[0]) {
          std::vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>::
          _M_realloc_insert<Catch::ThreadedSectionInfo*const&>
                    ((vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>
                      *)&local_48,iStack_40,&local_50);
        }
        else {
          *iStack_40._M_current = local_50;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
        ppTVar2 = local_48;
        local_50 = local_50->parent;
      } while (local_50 != (ThreadedSectionInfo *)0x0);
      local_50 = (ThreadedSectionInfo *)0x0;
      iVar7._M_current = iStack_40._M_current;
      if (local_48 != iStack_40._M_current) {
        for (; iVar7._M_current != ppTVar2; iVar7._M_current = iVar7._M_current + -1) {
          printHeaderString(this,&(iVar7._M_current[-1]->super_SectionInfo).name,2);
        }
      }
      if (local_48 != (ThreadedSectionInfo **)0x0) {
        operator_delete(local_48);
      }
    }
    Colour::~Colour(&local_51);
    pTVar3 = (this->super_StreamingReporterBase).currentSectionInfo.m_p;
  }
  pSVar8 = &((this->super_StreamingReporterBase).unusedTestCaseInfo.nullableValue)->lineInfo;
  if (pTVar3 != (ThreadedSectionInfo *)0x0) {
    pSVar8 = &(pTVar3->super_SectionInfo).lineInfo;
  }
  pcVar1 = (pSVar8->file)._M_dataplus._M_p;
  local_48 = (ThreadedSectionInfo **)local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (pSVar8->file)._M_string_length);
  local_28 = pSVar8->line;
  if (iStack_40._M_current != (ThreadedSectionInfo **)0x0) {
    poVar5 = (this->super_StreamingReporterBase).stream;
    psVar4 = getDashes_abi_cxx11_();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    Colour::Colour((Colour *)&local_50,FileName);
    poVar5 = (this->super_StreamingReporterBase).stream;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_48,(long)iStack_40._M_current);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    Colour::~Colour((Colour *)&local_50);
  }
  poVar5 = (this->super_StreamingReporterBase).stream;
  psVar4 = getDots_abi_cxx11_();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (local_48 != (ThreadedSectionInfo **)local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void printTestCaseAndSectionHeader() {
            printOpenHeader( unusedTestCaseInfo->name );
            if( currentSectionInfo ) {
                Colour colourGuard( Colour::Headers );
                std::vector<ThreadedSectionInfo*> sections;
                for(    ThreadedSectionInfo* section = currentSectionInfo.get();
                        section;
                        section = section->parent )
                    sections.push_back( section );

                // Sections
                if( !sections.empty() ) {
                    typedef std::vector<ThreadedSectionInfo*>::const_reverse_iterator It;
                    for( It it = sections.rbegin(), itEnd = sections.rend(); it != itEnd; ++it )
                        printHeaderString( (*it)->name, 2 );

                }
            }
            SourceLineInfo lineInfo = currentSectionInfo
                                    ? currentSectionInfo->lineInfo
                                    : unusedTestCaseInfo->lineInfo;

            if( !lineInfo.empty() ){
                stream << getDashes() << "\n";
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << "\n";
            }
            stream << getDots() << "\n" << std::endl;
        }